

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nesintf.c
# Opt level: O0

void nes_write_ram(void *chip,UINT32 offset,UINT32 length,UINT8 *data)

{
  uint local_2c;
  UINT32 remBytes;
  NESAPU_INF *info;
  UINT8 *data_local;
  UINT32 length_local;
  UINT32 offset_local;
  void *chip_local;
  
  if (offset < 0x10000) {
    info = (NESAPU_INF *)data;
    data_local._0_4_ = length;
    data_local._4_4_ = offset;
    if (offset < 0x8000) {
      if (offset + length < 0x8001) {
        return;
      }
      data_local._4_4_ = 0x8000;
      info = (NESAPU_INF *)(data + (0x8000 - offset));
      data_local._0_4_ = length - (0x8000 - offset);
    }
    local_2c = 0;
    if (0x10000 < data_local._4_4_ + (UINT32)data_local) {
      local_2c = (UINT32)data_local - (0x10000 - data_local._4_4_);
      data_local._0_4_ = 0x10000 - data_local._4_4_;
    }
    memcpy((void *)(*(long *)((long)chip + 0x20) + (ulong)(data_local._4_4_ - 0x8000)),info,
           (ulong)(UINT32)data_local);
    if (local_2c != 0) {
      if (0x8000 < local_2c) {
        local_2c = 0x8000;
      }
      memcpy(*(void **)((long)chip + 0x20),
             (void *)((long)&(info->_devData).chipInf + (ulong)(UINT32)data_local),(ulong)local_2c);
    }
  }
  return;
}

Assistant:

static void nes_write_ram(void* chip, UINT32 offset, UINT32 length, const UINT8* data)
{
	NESAPU_INF* info = (NESAPU_INF*)chip;
	UINT32 remBytes;
	
	if (offset >= 0x10000)
		return;
	
	// if (offset < 0x8000), then just copy the part for 0x8000+
	if (offset < 0x8000)
	{
		if (offset + length <= 0x8000)
			return;
		
		remBytes = 0x8000 - offset;
		offset = 0x8000;
		data += remBytes;
		length -= remBytes;
	}
	
	remBytes = 0x0000;
	if (offset + length > 0x10000)
	{
		remBytes = length;
		length = 0x10000 - offset;
		remBytes -= length;
	}
	memcpy(info->memory + (offset - 0x8000), data, length);
	// if we're crossing the boundary for 0x10000,
	// copy the bytes for 0x10000+ to 0x8000+
	if (remBytes)
	{
		if (remBytes > 0x8000)
			remBytes = 0x8000;
		memcpy(info->memory, data + length, remBytes);
	}
	
	return;
}